

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::
basic_json_encoder(basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>
                   *this,stream_sink<wchar_t> *sink,basic_json_encode_options<wchar_t> *options,
                  allocator<char> *alloc)

{
  spaces_option sVar1;
  pointer pwVar2;
  wchar_t *pwVar3;
  wchar_t *local_c8;
  undefined8 local_c0;
  long local_b8 [2];
  undefined8 local_a4;
  undefined4 local_9c;
  wstring *local_98;
  wstring *local_90;
  wstring *local_88;
  wstring *local_80;
  wstring *local_78;
  wstring *local_70;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *local_68;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *local_58;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *local_50;
  vector<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
  *local_48;
  write_double *local_40;
  basic_json_encode_options<wchar_t> *local_38;
  
  (this->super_basic_json_visitor<wchar_t>)._vptr_basic_json_visitor =
       (_func_int **)&PTR__basic_json_encoder_00b48270;
  pwVar2 = (sink->buffer_).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->sink_).stream_ptr_ = sink->stream_ptr_;
  (this->sink_).buffer_.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
  super__Vector_impl_data._M_start = pwVar2;
  pwVar2 = (sink->buffer_).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->sink_).buffer_.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (sink->buffer_).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->sink_).buffer_.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pwVar2;
  (sink->buffer_).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (sink->buffer_).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (sink->buffer_).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sink_).p_ = sink->p_;
  pwVar3 = sink->end_buffer_;
  (this->sink_).begin_buffer_ = sink->begin_buffer_;
  (this->sink_).end_buffer_ = pwVar3;
  basic_json_encode_options<wchar_t>::basic_json_encode_options(&this->options_,options);
  local_40 = &this->fp_;
  local_38 = &this->options_;
  detail::write_double::write_double(local_40,options->float_format_,(int)options->precision_);
  local_48 = &this->stack_;
  this->column_ = 0;
  local_90 = (wstring *)&this->colon_str_;
  local_50 = &(this->colon_str_).field_2;
  (this->stack_).
  super__Vector_base<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stack_).
  super__Vector_base<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->stack_).
           super__Vector_base<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->stack_).
           super__Vector_base<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->colon_str_)._M_dataplus._M_p = (pointer)local_50;
  (this->colon_str_)._M_string_length = 0;
  (this->colon_str_).field_2._M_local_buf[0] = L'\0';
  local_98 = (wstring *)&this->comma_str_;
  local_58 = &(this->comma_str_).field_2;
  (this->comma_str_)._M_dataplus._M_p = (pointer)local_58;
  (this->comma_str_)._M_string_length = 0;
  (this->comma_str_).field_2._M_local_buf[0] = L'\0';
  local_70 = (wstring *)&this->open_object_brace_str_;
  local_60 = &(this->open_object_brace_str_).field_2;
  (this->open_object_brace_str_)._M_dataplus._M_p = (pointer)local_60;
  (this->open_object_brace_str_)._M_string_length = 0;
  (this->open_object_brace_str_).field_2._M_local_buf[0] = L'\0';
  local_78 = (wstring *)&this->close_object_brace_str_;
  local_68 = &(this->close_object_brace_str_).field_2;
  (this->close_object_brace_str_)._M_dataplus._M_p = (pointer)local_68;
  (this->close_object_brace_str_)._M_string_length = 0;
  (this->close_object_brace_str_).field_2._M_local_buf[0] = L'\0';
  local_80 = (wstring *)&this->open_array_bracket_str_;
  (this->open_array_bracket_str_)._M_dataplus._M_p =
       (pointer)&(this->open_array_bracket_str_).field_2;
  (this->open_array_bracket_str_)._M_string_length = 0;
  (this->open_array_bracket_str_).field_2._M_local_buf[0] = L'\0';
  local_88 = (wstring *)&this->close_array_bracket_str_;
  (this->close_array_bracket_str_)._M_dataplus._M_p =
       (pointer)&(this->close_array_bracket_str_).field_2;
  (this->close_array_bracket_str_)._M_string_length = 0;
  (this->close_array_bracket_str_).field_2._M_local_buf[0] = L'\0';
  this->nesting_depth_ = 0;
  sVar1 = options->spaces_around_colon_;
  if (sVar1 == space_after) {
    local_a4 = 0x200000003a;
    local_c8 = (wchar_t *)local_b8;
    wmemcpy((wchar_t *)local_b8,(wchar_t *)&local_a4,2);
    local_c0 = 2;
    local_c8[2] = L'\0';
    std::__cxx11::wstring::operator=(local_90,(wstring *)&local_c8);
    if (local_c8 != (wchar_t *)local_b8) goto LAB_005915fa;
  }
  else {
    if (sVar1 == space_before) {
      local_a4 = 0x3a00000020;
      local_c8 = (wchar_t *)local_b8;
      wmemcpy(local_c8,(wchar_t *)&local_a4,2);
      local_c0 = 2;
      local_c8[2] = L'\0';
    }
    else {
      if (sVar1 != space_before_and_after) {
        std::__cxx11::wstring::push_back((wchar_t)local_90);
        goto LAB_0059161d;
      }
      local_a4 = 0x3a00000020;
      local_9c = 0x20;
      local_c8 = (wchar_t *)local_b8;
      wmemcpy(local_c8,(wchar_t *)&local_a4,3);
      local_c0 = 3;
      local_c8[3] = L'\0';
    }
    std::__cxx11::wstring::operator=(local_90,(wstring *)&local_c8);
    if (local_c8 != (wchar_t *)local_b8) {
LAB_005915fa:
      operator_delete(local_c8,local_b8[0] * 4 + 4);
    }
  }
LAB_0059161d:
  sVar1 = options->spaces_around_comma_;
  if (sVar1 == space_before_and_after) {
    local_a4 = 0x2c00000020;
    local_9c = 0x20;
    local_c8 = (wchar_t *)local_b8;
    wmemcpy(local_c8,(wchar_t *)&local_a4,3);
    local_c0 = 3;
    local_c8[3] = L'\0';
  }
  else {
    if (sVar1 == space_before) {
      local_a4 = 0x2c00000020;
    }
    else {
      if (sVar1 != space_after) {
        std::__cxx11::wstring::push_back((wchar_t)local_98);
        goto LAB_005916fc;
      }
      local_a4 = 0x200000002c;
    }
    local_c8 = (wchar_t *)local_b8;
    wmemcpy(local_c8,(wchar_t *)&local_a4,2);
    local_c0 = 2;
    local_c8[2] = L'\0';
  }
  std::__cxx11::wstring::operator=(local_98,(wstring *)&local_c8);
  if (local_c8 != (wchar_t *)local_b8) {
    operator_delete(local_c8,local_b8[0] * 4 + 4);
  }
LAB_005916fc:
  if ((options->field_0x8 & 4) == 0) {
    std::__cxx11::wstring::push_back((wchar_t)local_70);
    std::__cxx11::wstring::push_back((wchar_t)local_78);
  }
  else {
    local_a4 = 0x200000007b;
    local_c8 = (wchar_t *)local_b8;
    wmemcpy((wchar_t *)local_b8,(wchar_t *)&local_a4,2);
    local_c0 = 2;
    local_c8[2] = L'\0';
    std::__cxx11::wstring::operator=(local_70,(wstring *)&local_c8);
    if (local_c8 != (wchar_t *)local_b8) {
      operator_delete(local_c8,local_b8[0] * 4 + 4);
    }
    local_a4 = 0x7d00000020;
    local_c8 = (wchar_t *)local_b8;
    wmemcpy((wchar_t *)local_b8,(wchar_t *)&local_a4,2);
    local_c0 = 2;
    local_c8[2] = L'\0';
    std::__cxx11::wstring::operator=(local_78,(wstring *)&local_c8);
    if (local_c8 != (wchar_t *)local_b8) {
      operator_delete(local_c8,local_b8[0] * 4 + 4);
    }
  }
  if ((options->field_0x8 & 8) == 0) {
    std::__cxx11::wstring::push_back((wchar_t)local_80);
    std::__cxx11::wstring::push_back((wchar_t)local_88);
  }
  else {
    local_a4 = 0x200000005b;
    local_c8 = (wchar_t *)local_b8;
    wmemcpy((wchar_t *)local_b8,(wchar_t *)&local_a4,2);
    local_c0 = 2;
    local_c8[2] = L'\0';
    std::__cxx11::wstring::operator=(local_80,(wstring *)&local_c8);
    if (local_c8 != (wchar_t *)local_b8) {
      operator_delete(local_c8,local_b8[0] * 4 + 4);
    }
    local_a4 = 0x5d00000020;
    local_c8 = (wchar_t *)local_b8;
    wmemcpy((wchar_t *)local_b8,(wchar_t *)&local_a4,2);
    local_c0 = 2;
    local_c8[2] = L'\0';
    std::__cxx11::wstring::operator=(local_88,(wstring *)&local_c8);
    if (local_c8 != (wchar_t *)local_b8) {
      operator_delete(local_c8,local_b8[0] * 4 + 4);
    }
  }
  return;
}

Assistant:

basic_json_encoder(Sink&& sink, 
                           const basic_json_encode_options<CharT>& options, 
                           const Allocator& alloc = Allocator())
           : sink_(std::forward<Sink>(sink)), 
             options_(options),
             fp_(options.float_format(), options.precision()),
             stack_(alloc)
        {
            switch (options.spaces_around_colon())
            {
                case spaces_option::space_after:
                    colon_str_ = std::basic_string<CharT>({':',' '});
                    break;
                case spaces_option::space_before:
                    colon_str_ = std::basic_string<CharT>({' ',':'});
                    break;
                case spaces_option::space_before_and_after:
                    colon_str_ = std::basic_string<CharT>({' ',':',' '});
                    break;
                default:
                    colon_str_.push_back(':');
                    break;
            }
            switch (options.spaces_around_comma())
            {
                case spaces_option::space_after:
                    comma_str_ = std::basic_string<CharT>({',',' '});
                    break;
                case spaces_option::space_before:
                    comma_str_ = std::basic_string<CharT>({' ',','});
                    break;
                case spaces_option::space_before_and_after:
                    comma_str_ = std::basic_string<CharT>({' ',',',' '});
                    break;
                default:
                    comma_str_.push_back(',');
                    break;
            }
            if (options.pad_inside_object_braces())
            {
                open_object_brace_str_ = std::basic_string<CharT>({'{', ' '});
                close_object_brace_str_ = std::basic_string<CharT>({' ', '}'});
            }
            else
            {
                open_object_brace_str_.push_back('{');
                close_object_brace_str_.push_back('}');
            }
            if (options.pad_inside_array_brackets())
            {
                open_array_bracket_str_ = std::basic_string<CharT>({'[', ' '});
                close_array_bracket_str_ = std::basic_string<CharT>({' ', ']'});
            }
            else
            {
                open_array_bracket_str_.push_back('[');
                close_array_bracket_str_.push_back(']');
            }
        }